

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O2

OCSPRevocationStatus
bssl::anon_unknown_20::CheckOCSP
          (string_view raw_response,string_view certificate_der,ParsedCertificate *certificate,
          string_view issuer_certificate_der,ParsedCertificate *issuer_certificate,
          int64_t verify_time_epoch_seconds,optional<long> max_age_seconds,
          ResponseStatus *response_details)

{
  size_t *psVar1;
  Input *pIVar2;
  _Rb_tree_header *p_Var3;
  Span<const_unsigned_char> *pSVar4;
  Input lhs;
  Input value;
  Input raw_tlv;
  Input extensions_tlv;
  Input hash;
  Input hash_00;
  Input lhs_00;
  Input extensions_tlv_00;
  ResponseStatus RVar5;
  pointer pIVar6;
  uchar *this;
  bool bVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  EVP_MD *type;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *pvVar10;
  OCSPResponseData *out;
  OCSPSingleResponse *out_00;
  Input *spk_tlv;
  OCSPRevocationStatus OVar11;
  OCSPRevocationStatus OVar12;
  GeneralizedTime *this_update;
  ParsedCertificate *pPVar13;
  Input *key_purpose_oid;
  Span<const_unsigned_char> *pSVar14;
  pointer pIVar15;
  Input raw_tlv_00;
  string_view der;
  string_view der_00;
  string_view der_01;
  Input rhs;
  Input rhs_00;
  Input raw_tlv_01;
  Input raw_tlv_02;
  Input spki_tlv;
  optional<long> max_age_seconds_00;
  undefined8 local_1b8;
  undefined2 uStack_1b0;
  undefined6 uStack_1ae;
  OCSPSingleResponse single_response;
  map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
  extensions;
  shared_ptr<const_bssl::ParsedCertificate> parsed_issuer_certificate;
  shared_ptr<const_bssl::ParsedCertificate> parsed_certificate;
  OCSPResponseData response_data;
  OCSPResponse response;
  
  *response_details = NOT_CHECKED;
  if (raw_response._M_len == 0) {
    *response_details = MISSING;
    return MAX_VALUE;
  }
  out = (OCSPResponseData *)&response.certs;
  response.data.data_.data_ = (uchar *)0x0;
  response.data.data_.size_ = 0;
  response.signature.bytes_.data_.data_ = (uchar *)0x0;
  response.signature.bytes_.data_.size_ = 0;
  response.signature.unused_bits_ = '\0';
  response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  raw_tlv_00.data_.size_ = raw_response._M_len;
  raw_tlv_00.data_.data_ = (uchar *)raw_response._M_str;
  pPVar13 = issuer_certificate;
  bVar7 = ParseOCSPResponse(raw_tlv_00,&response);
  OVar12 = MAX_VALUE;
  if (!bVar7) {
    *response_details = PARSE_RESPONSE_ERROR;
    goto LAB_0037bde6;
  }
  if (response.status != SUCCESSFUL) {
    *response_details = ERROR_RESPONSE;
    goto LAB_0037bde6;
  }
  response_data.responder_id.key_hash.data_.data_ = (uchar *)0x0;
  response_data.responder_id.key_hash.data_.size_ = 0;
  response_data.responder_id.name.data_.data_ = (uchar *)0x0;
  response_data.responder_id.name.data_.size_ = 0;
  response_data.responses.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  response_data.responses.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  response_data.responses.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  response_data.extensions.data_.data_ = (uchar *)0x0;
  response_data.extensions.data_.size_ = 0;
  raw_tlv_01.data_.size_ = (size_t)&response_data;
  raw_tlv_01.data_.data_ = (uchar *)response.data.data_.size_;
  bVar7 = ParseOCSPResponseData((bssl *)response.data.data_.data_,raw_tlv_01,out);
  if (bVar7) {
    if (response_data.has_extensions == true) {
      psVar1 = &single_response.cert_id_tlv.data_.size_;
      extensions_tlv_00.data_.size_ = response_data.extensions.data_.size_;
      extensions_tlv_00.data_.data_ = response_data.extensions.data_.data_;
      single_response.cert_id_tlv.data_.size_._0_4_ = 0;
      single_response.cert_status.status = GOOD;
      single_response.cert_status.revocation_time.year = 0;
      single_response.cert_status.revocation_time.month = '\0';
      single_response.cert_status.revocation_time.day = '\0';
      single_response.this_update.hours = '\0';
      single_response.this_update.minutes = '\0';
      single_response.this_update.seconds = '\0';
      single_response.this_update._7_1_ = 0;
      single_response.has_next_update = false;
      single_response._45_1_ = 0;
      single_response.next_update.year = 0;
      single_response.cert_status._8_8_ = psVar1;
      single_response._32_8_ = psVar1;
      bVar7 = ParseExtensions(extensions_tlv_00,
                              (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                               *)&single_response);
      p_Var8 = (_Rb_tree_node_base *)single_response.cert_status._8_8_;
      if (!bVar7) {
        RVar5 = PARSE_RESPONSE_DATA_ERROR;
LAB_0037bdc8:
        *response_details = RVar5;
        ::std::
        _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
        ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                     *)&single_response);
        goto LAB_0037bdd6;
      }
      for (; p_Var8 != (_Rb_tree_node_base *)psVar1;
          p_Var8 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var8)) {
        if (*(char *)&p_Var8[2]._M_left != '\0') {
          RVar5 = RESPONSE_STATUS_MAX;
          goto LAB_0037bdc8;
        }
      }
      ::std::
      _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
      ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                   *)&single_response);
    }
    parsed_certificate.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    parsed_certificate.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    parsed_issuer_certificate.
    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    parsed_issuer_certificate.
    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (certificate == (ParsedCertificate *)0x0) {
      der._M_str = (char *)certificate_der._M_len;
      der._M_len = (size_t)&single_response;
      OCSPParseCertificate(der);
      ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&parsed_certificate.
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
                 &single_response);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &single_response.cert_id_tlv.data_.size_);
      certificate = parsed_certificate.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
    }
    if (issuer_certificate == (ParsedCertificate *)0x0) {
      der_00._M_str = (char *)issuer_certificate_der._M_len;
      der_00._M_len = (size_t)&single_response;
      OCSPParseCertificate(der_00);
      ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&parsed_issuer_certificate.
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
                 &single_response);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &single_response.cert_id_tlv.data_.size_);
      issuer_certificate =
           parsed_issuer_certificate.
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (certificate == (ParsedCertificate *)0x0 || issuer_certificate == (ParsedCertificate *)0x0) {
      *response_details = NOT_CHECKED;
LAB_0037bda7:
      OVar12 = MAX_VALUE;
    }
    else {
      bVar7 = bssl::der::operator<
                        (&response_data.produced_at,&(certificate->tbs_).validity_not_before);
      if ((bVar7) ||
         (bVar7 = bssl::der::operator>
                            (&response_data.produced_at,&(certificate->tbs_).validity_not_after),
         pIVar6 = response_data.responses.
                  super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                  super__Vector_impl_data._M_finish, bVar7)) {
        *response_details = BAD_PRODUCED_AT;
        goto LAB_0037bda7;
      }
      *response_details = NO_MATCHING_RESPONSE;
      p_Var3 = &extensions._M_t._M_impl.super__Rb_tree_header;
      OVar12 = MAX_VALUE;
      for (out_00 = (OCSPSingleResponse *)
                    response_data.responses.
                    super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                    super__Vector_impl_data._M_start; out_00 != (OCSPSingleResponse *)pIVar6;
          out_00 = (OCSPSingleResponse *)&out_00->cert_status) {
        single_response.cert_id_tlv.data_.data_ = (uchar *)0x0;
        single_response.cert_id_tlv.data_.size_._0_4_ = 0;
        single_response.cert_id_tlv.data_.size_._4_4_ = 0;
        single_response.extensions.data_.data_ = (uchar *)0x0;
        single_response.extensions.data_.size_ = 0;
        raw_tlv_02.data_.size_ = (size_t)&single_response;
        raw_tlv_02.data_.data_ = (uchar *)(out_00->cert_id_tlv).data_.size_;
        bVar7 = ParseOCSPSingleResponse((bssl *)(out_00->cert_id_tlv).data_.data_,raw_tlv_02,out_00)
        ;
        if (!bVar7) {
LAB_0037c0d1:
          OVar12 = MAX_VALUE;
          break;
        }
        if (single_response.has_extensions == true) {
          extensions_tlv.data_.size_ = single_response.extensions.data_.size_;
          extensions_tlv.data_.data_ = single_response.extensions.data_.data_;
          extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
          extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
          bVar7 = ParseExtensions(extensions_tlv,&extensions);
          if (!bVar7) {
            *response_details = PARSE_RESPONSE_DATA_ERROR;
LAB_0037c0c7:
            ::std::
            _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
            ::~_Rb_tree(&extensions._M_t);
            goto LAB_0037c0d1;
          }
          local_1b8 = 0x279d6010401062b;
          uStack_1b0 = 0x504;
          for (p_Var9 = extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var9 != p_Var3;
              p_Var9 = (_Base_ptr)::std::_Rb_tree_increment(p_Var9)) {
            lhs.data_.data_ = (uchar *)p_Var9[1]._M_left;
            lhs.data_.size_ = (size_t)p_Var9[1]._M_right;
            rhs.data_.size_ = 10;
            rhs.data_.data_ = (uchar *)&local_1b8;
            bVar7 = bssl::der::operator==(lhs,rhs);
            if ((!bVar7) && (*(char *)&p_Var9[2]._M_left != '\0')) {
              *response_details = RESPONSE_STATUS_MAX;
              goto LAB_0037c0c7;
            }
          }
          ::std::
          _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
          ::~_Rb_tree(&extensions._M_t);
        }
        extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        extensions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        raw_tlv.data_.size_._0_4_ = (undefined4)single_response.cert_id_tlv.data_.size_;
        raw_tlv.data_.data_ = single_response.cert_id_tlv.data_.data_;
        raw_tlv.data_.size_._4_4_ = single_response.cert_id_tlv.data_.size_._4_4_;
        bVar7 = ParseOCSPCertID(raw_tlv,(OCSPCertID *)&extensions);
        if (!bVar7) goto LAB_0037c0d1;
        switch(extensions._M_t._M_impl._0_4_) {
        case (BADTYPE)0x0:
        case (BADTYPE)0x1:
        case (BADTYPE)0x2:
          goto switchD_0037bf82_caseD_0;
        case (BADTYPE)0x3:
          type = EVP_sha1();
          break;
        case (BADTYPE)0x4:
          type = EVP_sha256();
          break;
        case (BADTYPE)0x5:
          type = EVP_sha384();
          break;
        case (BADTYPE)0x6:
          type = EVP_sha512();
          break;
        default:
          type = (EVP_MD *)0x0;
        }
        hash.data_.data_._4_4_ = extensions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
        hash.data_.data_._0_4_ = extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        hash.data_.size_ = (size_t)extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        pIVar2 = &(certificate->tbs_).issuer_tlv;
        spk_tlv = (Input *)(pIVar2->data_).data_;
        bVar7 = VerifyHash((EVP_MD *)type,hash,(Input)pIVar2->data_);
        if (bVar7) {
          local_1b8 = 0;
          uStack_1b0 = 0;
          uStack_1ae = 0;
          spki_tlv.data_.size_ = (size_t)&local_1b8;
          spki_tlv.data_.data_ = (uchar *)(issuer_certificate->tbs_).spki_tlv.data_.size_;
          bVar7 = GetSubjectPublicKeyBytes
                            ((anon_unknown_20 *)(issuer_certificate->tbs_).spki_tlv.data_.data_,
                             spki_tlv,spk_tlv);
          if (((bVar7) &&
              (hash_00.data_.size_ =
                    (size_t)extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
              hash_00.data_.data_ =
                   (uchar *)extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
              value.data_.size_._0_2_ = uStack_1b0, value.data_.data_ = (uchar *)local_1b8,
              value.data_.size_._2_6_ = uStack_1ae, bVar7 = VerifyHash((EVP_MD *)type,hash_00,value)
              , bVar7)) &&
             (lhs_00.data_.size_ = 0,
             lhs_00.data_.data_ =
                  (uchar *)extensions._M_t._M_impl.super__Rb_tree_header._M_node_count,
             bVar7 = bssl::der::operator==(lhs_00,(Input)(certificate->tbs_).serial_number.data_),
             bVar7)) {
            this_update = (GeneralizedTime *)0x0;
            if (single_response.has_next_update != false) {
              this_update = &single_response.next_update;
            }
            max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload._M_value._1_7_ = 0;
            max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload._M_value._0_1_ =
                 max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_engaged;
            max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_ = pPVar13;
            bVar7 = CheckRevocationDateValid
                              ((bssl *)&single_response.this_update,this_update,
                               (GeneralizedTime *)verify_time_epoch_seconds,
                               max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long>._M_payload._M_value,
                               max_age_seconds_00);
            if (bVar7) {
              OVar11 = OVar12;
              if (single_response.cert_status.status == REVOKED) {
                OVar11 = single_response.cert_status.status;
              }
              if (OVar12 == GOOD) {
                OVar11 = single_response.cert_status.status;
              }
              OVar12 = OVar11;
              if (*response_details != PROVIDED) {
                OVar12 = single_response.cert_status.status;
              }
              *response_details = PROVIDED;
            }
            else if (*response_details != PROVIDED) {
              *response_details = INVALID_DATE;
            }
          }
        }
switchD_0037bf82_caseD_0:
      }
      bVar7 = CheckResponderIDMatchesCertificate(&response_data.responder_id,issuer_certificate);
      pIVar15 = response.certs.
                super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                super__Vector_impl_data._M_start;
      pIVar6 = response.certs.
               super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((!bVar7) ||
         (bVar7 = VerifyOCSPResponseSignatureGivenCert(&response,issuer_certificate),
         pIVar15 = response.certs.
                   super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                   super__Vector_impl_data._M_start,
         pIVar6 = response.certs.
                  super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                  super__Vector_impl_data._M_finish, !bVar7)) {
        for (; pIVar15 != pIVar6; pIVar15 = pIVar15 + 1) {
          der_01._M_str = (char *)(pIVar15->data_).size_;
          der_01._M_len = (size_t)&single_response;
          OCSPParseCertificate(der_01);
          if (((single_response.cert_id_tlv.data_.data_ != (uchar *)0x0) &&
              (bVar7 = CheckResponderIDMatchesCertificate
                                 (&response_data.responder_id,
                                  (ParsedCertificate *)single_response.cert_id_tlv.data_.data_),
              this = single_response.cert_id_tlv.data_.data_, bVar7)) &&
             (((*(ulong *)(single_response.cert_id_tlv.data_.data_ + 0x110) >> 0x20 & 1) != 0 &&
              ((bVar7 = VerifySignedData((SignatureAlgorithm)
                                         *(ulong *)(single_response.cert_id_tlv.data_.data_ + 0x110)
                                         ,(Input)*(Span<const_unsigned_char> *)
                                                  (single_response.cert_id_tlv.data_.data_ + 0x18),
                                         (BitString *)
                                         (single_response.cert_id_tlv.data_.data_ + 0x38),
                                         (Input)(issuer_certificate->tbs_).spki_tlv.data_,
                                         (SignatureVerifyCache *)0x0), bVar7 &&
               (this[0x178] == '\x01')))))) {
            pvVar10 = ParsedCertificate::extended_key_usage((ParsedCertificate *)this);
            pSVar14 = &((pvVar10->
                        super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
                        _M_impl.super__Vector_impl_data._M_start)->data_;
            pSVar4 = &((pvVar10->
                       super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
                       _M_impl.super__Vector_impl_data._M_finish)->data_;
            do {
              if (pSVar14 == pSVar4) goto LAB_0037c1e1;
              rhs_00.data_.size_ = 8;
              rhs_00.data_.data_ = "+\x06\x01\x05\x05\a\x03\tSerial number is not a valid INTEGER";
              bVar7 = bssl::der::operator==((Input)*pSVar14,rhs_00);
              pSVar14 = pSVar14 + 1;
            } while (!bVar7);
            bVar7 = VerifyOCSPResponseSignatureGivenCert
                              (&response,
                               (ParsedCertificate *)single_response.cert_id_tlv.data_.data_);
            if (bVar7) {
              ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &single_response.cert_id_tlv.data_.size_);
              goto LAB_0037bdaa;
            }
          }
LAB_0037c1e1:
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &single_response.cert_id_tlv.data_.size_);
        }
        goto LAB_0037bda7;
      }
    }
LAB_0037bdaa:
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&parsed_issuer_certificate.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&parsed_certificate.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    *response_details = PARSE_RESPONSE_DATA_ERROR;
LAB_0037bdd6:
    OVar12 = MAX_VALUE;
  }
  ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
            (&response_data.responses.
              super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>);
LAB_0037bde6:
  ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
            (&response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
            );
  return OVar12;
}

Assistant:

OCSPRevocationStatus CheckOCSP(
    std::string_view raw_response, std::string_view certificate_der,
    const ParsedCertificate *certificate,
    std::string_view issuer_certificate_der,
    const ParsedCertificate *issuer_certificate,
    int64_t verify_time_epoch_seconds, std::optional<int64_t> max_age_seconds,
    OCSPVerifyResult::ResponseStatus *response_details) {
  *response_details = OCSPVerifyResult::NOT_CHECKED;

  if (raw_response.empty()) {
    *response_details = OCSPVerifyResult::MISSING;
    return OCSPRevocationStatus::UNKNOWN;
  }

  OCSPResponse response;
  if (!ParseOCSPResponse(StringAsBytes(raw_response), &response)) {
    *response_details = OCSPVerifyResult::PARSE_RESPONSE_ERROR;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // RFC 6960 defines all responses |response_status| != SUCCESSFUL as error
  // responses. No revocation information is provided on error responses, and
  // the OCSPResponseData structure is not set.
  if (response.status != OCSPResponse::ResponseStatus::SUCCESSFUL) {
    *response_details = OCSPVerifyResult::ERROR_RESPONSE;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Actual revocation information is contained within the BasicOCSPResponse as
  // a ResponseData structure. The BasicOCSPResponse was parsed above, and
  // contains an unparsed ResponseData. From RFC 6960:
  //
  // BasicOCSPResponse       ::= SEQUENCE {
  //    tbsResponseData      ResponseData,
  //    signatureAlgorithm   AlgorithmIdentifier,
  //    signature            BIT STRING,
  //    certs            [0] EXPLICIT SEQUENCE OF Certificate OPTIONAL }
  //
  // ResponseData ::= SEQUENCE {
  //     version              [0] EXPLICIT Version DEFAULT v1,
  //     responderID              ResponderID,
  //     producedAt               GeneralizedTime,
  //     responses                SEQUENCE OF SingleResponse,
  //     responseExtensions   [1] EXPLICIT Extensions OPTIONAL }
  OCSPResponseData response_data;
  if (!ParseOCSPResponseData(response.data, &response_data)) {
    *response_details = OCSPVerifyResult::PARSE_RESPONSE_DATA_ERROR;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Process the OCSP ResponseData extensions. In particular, must reject if
  // there are any critical extensions that are not understood.
  if (response_data.has_extensions &&
      !ParseOCSPResponseDataExtensions(response_data.extensions,
                                       response_details)) {
    return OCSPRevocationStatus::UNKNOWN;
  }

  std::shared_ptr<const ParsedCertificate> parsed_certificate;
  std::shared_ptr<const ParsedCertificate> parsed_issuer_certificate;
  if (!certificate) {
    parsed_certificate = OCSPParseCertificate(certificate_der);
    certificate = parsed_certificate.get();
  }
  if (!issuer_certificate) {
    parsed_issuer_certificate = OCSPParseCertificate(issuer_certificate_der);
    issuer_certificate = parsed_issuer_certificate.get();
  }

  if (!certificate || !issuer_certificate) {
    *response_details = OCSPVerifyResult::NOT_CHECKED;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // If producedAt is outside of the certificate validity period, reject the
  // response.
  if (response_data.produced_at < certificate->tbs().validity_not_before ||
      response_data.produced_at > certificate->tbs().validity_not_after) {
    *response_details = OCSPVerifyResult::BAD_PRODUCED_AT;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Look through all of the OCSPSingleResponses for a match (based on CertID
  // and time).
  OCSPRevocationStatus status = GetRevocationStatusForCert(
      response_data, certificate, issuer_certificate, verify_time_epoch_seconds,
      max_age_seconds, response_details);

  // Check that the OCSP response has a valid signature. It must either be
  // signed directly by the issuing certificate, or a valid authorized
  // responder.
  if (!VerifyOCSPResponseSignature(response, response_data,
                                   issuer_certificate)) {
    return OCSPRevocationStatus::UNKNOWN;
  }

  return status;
}